

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfgmr.c
# Opt level: O0

int sfgmr(int n,_func_void_float_float_ptr_float_float_ptr *smatvec,
         _func_void_int_float_ptr_float_ptr *spsolve,float *rhs,float *sol,double tol,int im,
         int *itmax,FILE *fits)

{
  bool bVar1;
  int iVar2;
  float *pfVar3;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *extraout_RDX_01;
  float *extraout_RDX_02;
  float *extraout_RDX_03;
  real rVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  int local_104;
  int local_100;
  int i_6;
  int i_5;
  int retval;
  int j_6;
  int k_3;
  float tt_4;
  int j_5;
  int j_4;
  float tt_3;
  int k_2;
  int ii;
  float gam;
  float tt_2;
  int k1;
  int k_1;
  int k;
  float tt_1;
  float negt_1;
  int j_3;
  float tt;
  float negt;
  int j_2;
  float t0;
  int i1;
  int i_4;
  int j_1;
  float t;
  float beta;
  int j;
  int i_3;
  int i;
  float one;
  float zero;
  float **z;
  float **vv;
  float *rs;
  float *s;
  float *c;
  float **hh;
  float eps1;
  int i_2;
  int i_1;
  int its;
  int maxits;
  int im_local;
  double tol_local;
  float *sol_local;
  float *rhs_local;
  _func_void_int_float_ptr_float_ptr *spsolve_local;
  _func_void_float_float_ptr_float_float_ptr *smatvec_local;
  int n_local;
  
  i_1 = *itmax;
  eps1 = 1.4013e-45;
  hh._4_4_ = 2;
  hh._0_4_ = 0.0;
  i = 0;
  i_3 = 0x3f800000;
  i_2 = 0;
  its = im;
  _maxits = tol;
  tol_local = (double)sol;
  sol_local = rhs;
  rhs_local = (float *)spsolve;
  spsolve_local = (_func_void_int_float_ptr_float_ptr *)smatvec;
  smatvec_local._4_4_ = n;
  z = (float **)superlu_malloc((long)(im + 1) << 3);
  for (j = 0; j <= its; j = j + 1) {
    pfVar3 = floatMalloc((long)smatvec_local._4_4_);
    z[j] = pfVar3;
  }
  _one = superlu_malloc((long)its << 3);
  c = (float *)superlu_malloc((long)its << 3);
  for (beta = 0.0; (int)beta < its; beta = (float)((int)beta + 1)) {
    pfVar3 = floatMalloc((long)((int)beta + 2));
    *(float **)(c + (long)(int)beta * 2) = pfVar3;
    pfVar3 = floatMalloc((long)smatvec_local._4_4_);
    *(float **)((long)_one + (long)(int)beta * 8) = pfVar3;
  }
  s = floatMalloc((long)its);
  rs = floatMalloc((long)its);
  vv = (float **)floatMalloc((long)(its + 1));
  pfVar3 = extraout_RDX;
  do {
    (*spsolve_local)(SUB84(tol_local,0),*z,pfVar3);
    for (t = 0.0; (int)t < smatvec_local._4_4_; t = (float)((int)t + 1)) {
      (*z)[(int)t] = sol_local[(int)t] - (*z)[(int)t];
    }
    j_1 = (int)snrm2_((integer *)((long)&smatvec_local + 4),*z,(integer *)&eps1);
    if ((fits != (FILE *)0x0) && (i_2 == 0)) {
      fprintf((FILE *)fits,"%8d   %10.2e\n",(double)(float)j_1,0);
    }
    dVar7 = _maxits;
    dVar6 = (double)(float)j_1;
    rVar4 = snrm2_((integer *)((long)&smatvec_local + 4),sol_local,(integer *)&eps1);
    if (dVar6 <= dVar7 * (double)rVar4) goto LAB_001033a1;
    i_4 = (int)(1.0 / (float)j_1);
    for (i1 = 0; i1 < smatvec_local._4_4_; i1 = i1 + 1) {
      (*z)[i1] = (*z)[i1] * (float)i_4;
    }
    if (i_2 == 0) {
      hh._0_4_ = (float)(_maxits * (double)(float)j_1);
    }
    *(int *)vv = j_1;
    pfVar3 = extraout_RDX_00;
    for (t0 = 0.0; (int)t0 < its; t0 = (float)((int)t0 + 1)) {
      i_2 = i_2 + 1;
      j_2 = (int)t0 + 1;
      if (rhs_local == (float *)0x0) {
        scopy_((integer *)((long)&smatvec_local + 4),z[(int)t0],(integer *)&eps1,
               *(real **)((long)_one + (long)(int)t0 * 8),(integer *)&eps1);
      }
      else {
        (*(code *)rhs_local)
                  (smatvec_local._4_4_,*(undefined8 *)((long)_one + (long)(int)t0 * 8),z[(int)t0]);
      }
      (*spsolve_local)((int)*(undefined8 *)((long)_one + (long)(int)t0 * 8),z[j_2],
                       (float *)(long)j_2);
      negt = snrm2_((integer *)((long)&smatvec_local + 4),z[j_2],(integer *)&eps1);
      for (tt = 0.0; (int)tt <= (int)t0; tt = (float)((int)tt + 1)) {
        negt_1 = sdot_((integer *)((long)&smatvec_local + 4),z[(int)tt],(integer *)&eps1,z[j_2],
                       (integer *)&eps1);
        *(float *)(*(long *)(c + (long)(int)t0 * 2) + (long)(int)tt * 4) = negt_1;
        j_3 = (int)-negt_1;
        saxpy_((integer *)((long)&smatvec_local + 4),(real *)&j_3,z[(int)tt],(integer *)&eps1,z[j_2]
               ,(integer *)&eps1);
      }
      i_4 = (int)snrm2_((integer *)((long)&smatvec_local + 4),z[j_2],(integer *)&eps1);
      while ((float)i_4 < negt * 0.5) {
        negt = (float)i_4;
        for (tt_1 = 0.0; (int)tt_1 <= (int)t0; tt_1 = (float)((int)tt_1 + 1)) {
          rVar4 = sdot_((integer *)((long)&smatvec_local + 4),z[(int)tt_1],(integer *)&eps1,z[j_2],
                        (integer *)&eps1);
          *(float *)(*(long *)(c + (long)(int)t0 * 2) + (long)(int)tt_1 * 4) =
               rVar4 + *(float *)(*(long *)(c + (long)(int)t0 * 2) + (long)(int)tt_1 * 4);
          k = (int)-rVar4;
          saxpy_((integer *)((long)&smatvec_local + 4),(real *)&k,z[(int)tt_1],(integer *)&eps1,
                 z[j_2],(integer *)&eps1);
        }
        i_4 = (int)snrm2_((integer *)((long)&smatvec_local + 4),z[j_2],(integer *)&eps1);
      }
      *(int *)(*(long *)(c + (long)(int)t0 * 2) + (long)j_2 * 4) = i_4;
      if (((float)i_4 != 0.0) || (NAN((float)i_4))) {
        i_4 = (int)(1.0 / (float)i_4);
        for (k1 = 0; k1 < smatvec_local._4_4_; k1 = k1 + 1) {
          z[j_2][k1] = z[j_2][k1] * (float)i_4;
        }
      }
      for (tt_2 = 1.4013e-45; (int)tt_2 <= (int)t0; tt_2 = (float)((int)tt_2 + 1)) {
        iVar2 = (int)tt_2 + -1;
        fVar5 = *(float *)(*(long *)(c + (long)(int)t0 * 2) + (long)iVar2 * 4);
        *(float *)(*(long *)(c + (long)(int)t0 * 2) + (long)iVar2 * 4) =
             s[iVar2] * fVar5 +
             rs[iVar2] * *(float *)(*(long *)(c + (long)(int)t0 * 2) + (long)(int)tt_2 * 4);
        *(float *)(*(long *)(c + (long)(int)t0 * 2) + (long)(int)tt_2 * 4) =
             -rs[iVar2] * fVar5 +
             s[iVar2] * *(float *)(*(long *)(c + (long)(int)t0 * 2) + (long)(int)tt_2 * 4);
      }
      dVar7 = pow((double)*(float *)(*(long *)(c + (long)(int)t0 * 2) + (long)(int)t0 * 4),2.0);
      dVar6 = pow((double)*(float *)(*(long *)(c + (long)(int)t0 * 2) + (long)j_2 * 4),2.0);
      dVar7 = sqrt(dVar7 + dVar6);
      fVar5 = (float)dVar7;
      if ((fVar5 != 0.0) || (NAN(fVar5))) {
        s[(int)t0] = *(float *)(*(long *)(c + (long)(int)t0 * 2) + (long)(int)t0 * 4) / fVar5;
        rs[(int)t0] = *(float *)(*(long *)(c + (long)(int)t0 * 2) + (long)j_2 * 4) / fVar5;
      }
      else {
        s[(int)t0] = (float)i_3;
        rs[(int)t0] = (float)i;
      }
      *(float *)((long)vv + (long)j_2 * 4) = -rs[(int)t0] * *(float *)((long)vv + (long)(int)t0 * 4)
      ;
      *(float *)((long)vv + (long)(int)t0 * 4) =
           s[(int)t0] * *(float *)((long)vv + (long)(int)t0 * 4);
      *(float *)(*(long *)(c + (long)(int)t0 * 2) + (long)(int)t0 * 4) =
           s[(int)t0] * *(float *)(*(long *)(c + (long)(int)t0 * 2) + (long)(int)t0 * 4) +
           rs[(int)t0] * *(float *)(*(long *)(c + (long)(int)t0 * 2) + (long)j_2 * 4);
      j_1 = (int)ABS(*(float *)((long)vv + (long)j_2 * 4));
      pfVar3 = extraout_RDX_01;
      if (fits != (FILE *)0x0) {
        fprintf((FILE *)fits,"%8d   %10.2e\n",(double)(float)j_1,(ulong)(uint)i_2);
        pfVar3 = extraout_RDX_02;
      }
      if (((float)j_1 <= hh._0_4_) || (i_1 <= i_2)) break;
    }
    if (t0 == (float)its) {
      t0 = (float)((int)t0 + -1);
    }
    *(float *)((long)vv + (long)(int)t0 * 4) =
         *(float *)((long)vv + (long)(int)t0 * 4) /
         *(float *)(*(long *)(c + (long)(int)t0 * 2) + (long)(int)t0 * 4);
    for (tt_3 = 1.4013e-45; (int)tt_3 <= (int)t0; tt_3 = (float)((int)tt_3 + 1)) {
      fVar5 = (float)((int)t0 - (int)tt_3);
      j_5 = *(int *)((long)vv + (long)(int)fVar5 * 4);
      tt_4 = fVar5;
      while (tt_4 = (float)((int)tt_4 + 1), (int)tt_4 <= (int)t0) {
        j_5 = (int)(-*(float *)(*(long *)(c + (long)(int)tt_4 * 2) + (long)(int)fVar5 * 4) *
                    *(float *)((long)vv + (long)(int)tt_4 * 4) + (float)j_5);
      }
      *(float *)((long)vv + (long)(int)fVar5 * 4) =
           (float)j_5 / *(float *)(*(long *)(c + (long)(int)fVar5 * 2) + (long)(int)fVar5 * 4);
    }
    for (k_3 = 0; k_3 <= (int)t0; k_3 = k_3 + 1) {
      fVar5 = *(float *)((long)vv + (long)k_3 * 4);
      for (retval = 0; retval < smatvec_local._4_4_; retval = retval + 1) {
        *(float *)((long)tol_local + (long)retval * 4) =
             fVar5 * *(float *)(*(long *)((long)_one + (long)k_3 * 8) + (long)retval * 4) +
             *(float *)((long)tol_local + (long)retval * 4);
      }
    }
    (*spsolve_local)(SUB84(tol_local,0),*z,pfVar3);
    for (i_5 = 0; i_5 < smatvec_local._4_4_; i_5 = i_5 + 1) {
      (*z)[i_5] = sol_local[i_5] - (*z)[i_5];
    }
    j_1 = (int)snrm2_((integer *)((long)&smatvec_local + 4),*z,(integer *)&eps1);
    if ((double)hh._0_4_ / _maxits <= (double)(float)j_1) {
      i_2 = i_1 + 10;
LAB_001033a1:
      bVar1 = i_1 <= i_2;
      for (local_100 = 0; local_100 <= its; local_100 = local_100 + 1) {
        superlu_free(z[local_100]);
      }
      superlu_free(z);
      for (local_104 = 0; local_104 < its; local_104 = local_104 + 1) {
        superlu_free(*(void **)(c + (long)local_104 * 2));
        superlu_free(*(void **)((long)_one + (long)local_104 * 8));
      }
      superlu_free(c);
      superlu_free(_one);
      superlu_free(s);
      superlu_free(rs);
      superlu_free(vv);
      *itmax = i_2;
      return (uint)bVar1;
    }
    if (((float)j_1 <= hh._0_4_) || (pfVar3 = extraout_RDX_03, i_1 <= i_2)) goto LAB_001033a1;
  } while( true );
}

Assistant:

int sfgmr(int n,
     void (*smatvec) (float, float[], float, float[]),
     void (*spsolve) (int, float[], float[]),
     float *rhs, float *sol, double tol, int im, int *itmax, FILE * fits)
{
/*----------------------------------------------------------------------
|                 *** Preconditioned FGMRES ***
+-----------------------------------------------------------------------
| This is a simple version of the ARMS preconditioned FGMRES algorithm.
+-----------------------------------------------------------------------
| Y. S. Dec. 2000. -- Apr. 2008
+-----------------------------------------------------------------------
| on entry:
|----------
|
| rhs     = real vector of length n containing the right hand side.
| sol     = real vector of length n containing an initial guess to the
|           solution on input.
| tol     = tolerance for stopping iteration
| im      = Krylov subspace dimension
| (itmax) = max number of iterations allowed.
| fits    = NULL: no output
|        != NULL: file handle to output " resid vs time and its"
|
| on return:
|----------
| fgmr      int =  0 --> successful return.
|           int =  1 --> convergence not achieved in itmax iterations.
| sol     = contains an approximate solution (upon successful return).
| itmax   = has changed. It now contains the number of steps required
|           to converge --
+-----------------------------------------------------------------------
| internal work arrays:
|----------
| vv      = work array of length [im+1][n] (used to store the Arnoldi
|           basis)
| hh      = work array of length [im][im+1] (Householder matrix)
| z       = work array of length [im][n] to store preconditioned vectors
+-----------------------------------------------------------------------
| subroutines called :
| matvec - matrix-vector multiplication operation
| psolve - (right) preconditioning operation
|	   psolve can be a NULL pointer (GMRES without preconditioner)
+---------------------------------------------------------------------*/

    int maxits = *itmax;
    int its, i_1 = 1, i_2 = 2;
    float eps1 = 0.0;
    float **hh, *c, *s, *rs;
    float **vv, **z;
    float zero = 0.0;
    float one = 1.0;

    its = 0;
    vv = (float **)SUPERLU_MALLOC((im + 1) * sizeof(float *));
    for (int i = 0; i <= im; i++) vv[i] = floatMalloc(n);
    z = (float **)SUPERLU_MALLOC(im * sizeof(float *));
    hh = (float **)SUPERLU_MALLOC(im * sizeof(float *));
    for (int i = 0; i < im; i++)
    {
	hh[i] = floatMalloc(i + 2);
	z[i] = floatMalloc(n);
    }
    c = floatMalloc(im);
    s = floatMalloc(im);
    rs = floatMalloc(im + 1);

    /*---- outer loop starts here ----*/
    do
    {
	/*---- compute initial residual vector ----*/
	smatvec(one, sol, zero, vv[0]);
	for (int j = 0; j < n; j++)
	    vv[0][j] = rhs[j] - vv[0][j];	/* vv[0]= initial residual */
	float beta = snrm2_(&n, vv[0], &i_1);

	/*---- print info if fits != null ----*/
	if (fits != NULL && its == 0)
	    fprintf(fits, "%8d   %10.2e\n", its, beta);
	/*if ( beta <= tol * dnrm2_(&n, rhs, &i_1) )*/
	if ( !(beta > tol * snrm2_(&n, rhs, &i_1)) )
	    break;
	float t = 1.0 / beta;

	/*---- normalize: vv[0] = vv[0] / beta ----*/
	for (int j = 0; j < n; j++)
	    vv[0][j] = vv[0][j] * t;
	if (its == 0)
	    eps1 = tol * beta;

	/*---- initialize 1-st term of rhs of hessenberg system ----*/
	rs[0] = beta;
	int i = 0;
	for (i = 0; i < im; i++)
	{
	    its++;
	    int i1 = i + 1;

	    /*------------------------------------------------------------
	    |  (Right) Preconditioning Operation   z_{j} = M^{-1} v_{j}
	    +-----------------------------------------------------------*/
	    if (spsolve)
		spsolve(n, z[i], vv[i]);
	    else
		scopy_(&n, vv[i], &i_1, z[i], &i_1);

	    /*---- matvec operation w = A z_{j} = A M^{-1} v_{j} ----*/
	    smatvec(one, z[i], zero, vv[i1]);

	    /*------------------------------------------------------------
	    |     modified gram - schmidt...
	    |     h_{i,j} = (w,v_{i})
	    |     w  = w - h_{i,j} v_{i}
	    +------------------------------------------------------------*/
	    float t0 = snrm2_(&n, vv[i1], &i_1);
	    for (int j = 0; j <= i; j++)
	    {
		float negt;
		float tt = sdot_(&n, vv[j], &i_1, vv[i1], &i_1);
		hh[i][j] = tt;
		negt = -tt;
		saxpy_(&n, &negt, vv[j], &i_1, vv[i1], &i_1);
	    }

	    /*---- h_{j+1,j} = ||w||_{2} ----*/
	    t = snrm2_(&n, vv[i1], &i_1);
	    while (t < 0.5 * t0)
	    {
		t0 = t;
		for (int j = 0; j <= i; j++)
		{
		    float negt;
		    float tt = sdot_(&n, vv[j], &i_1, vv[i1], &i_1);
		    hh[i][j] += tt;
		    negt = -tt;
		    saxpy_(&n, &negt, vv[j], &i_1, vv[i1], &i_1);
		}
		t = snrm2_(&n, vv[i1], &i_1);
	    }

	    hh[i][i1] = t;

	    if (t != 0.0)
	    {
		/*---- v_{j+1} = w / h_{j+1,j} ----*/
		t = 1.0 / t;
		for (int k = 0; k < n; k++)
		    vv[i1][k] = vv[i1][k] * t;
	    }
	    /*---------------------------------------------------
	    |     done with modified gram schmidt and arnoldi step
	    |     now  update factorization of hh
	    +--------------------------------------------------*/

	    /*--------------------------------------------------------
	    |   perform previous transformations  on i-th column of h
	    +-------------------------------------------------------*/
	    for (int k = 1; k <= i; k++)
	    {
		int k1 = k - 1;
		float tt = hh[i][k1];
		hh[i][k1] = c[k1] * tt + s[k1] * hh[i][k];
		hh[i][k] = -s[k1] * tt + c[k1] * hh[i][k];
	    }

	    float gam = sqrt(pow(hh[i][i], 2) + pow(hh[i][i1], 2));

	    /*---------------------------------------------------
	    |     if gamma is zero then any small value will do
	    |     affect only residual estimate
	    +--------------------------------------------------*/
	    /* if (gam == 0.0) gam = epsmac; */

	    /*---- get next plane rotation ---*/
	    if (gam == 0.0)
	    {
		c[i] = one;
		s[i] = zero;
	    }
            else
	    {
		c[i] = hh[i][i] / gam;
		s[i] = hh[i][i1] / gam;
	    }

	    rs[i1] = -s[i] * rs[i];
	    rs[i] = c[i] * rs[i];

	    /*----------------------------------------------------
	    |   determine residual norm and test for convergence
	    +---------------------------------------------------*/
	    hh[i][i] = c[i] * hh[i][i] + s[i] * hh[i][i1];
	    beta = fabs(rs[i1]);
	    if (fits != NULL)
		fprintf(fits, "%8d   %10.2e\n", its, beta);
	    if (beta <= eps1 || its >= maxits)
		break;
	}

	if (i == im) i--;

	/*---- now compute solution. 1st, solve upper triangular system ----*/
	rs[i] = rs[i] / hh[i][i];

	for (int ii = 1; ii <= i; ii++)
	{
	    int k = i - ii;
	    float tt = rs[k];
	    for (int j = k + 1; j <= i; j++)
		tt = tt - hh[j][k] * rs[j];
	    rs[k] = tt / hh[k][k];
	}

	/*---- linear combination of v[i]'s to get sol. ----*/
	for (int j = 0; j <= i; j++)
	{
	    float tt = rs[j];
	    for (int k = 0; k < n; k++)
		sol[k] += tt * z[j][k];
	}

	/* calculate the residual and output */
	smatvec(one, sol, zero, vv[0]);
	for (int j = 0; j < n; j++)
	    vv[0][j] = rhs[j] - vv[0][j];	/* vv[0]= initial residual */

	/*---- print info if fits != null ----*/
	beta = snrm2_(&n, vv[0], &i_1);

	/*---- restart outer loop if needed ----*/
	/*if (beta >= eps1 / tol)*/
	if ( !(beta < eps1 / tol) )
	{
	    its = maxits + 10;
	    break;
	}
	if (beta <= eps1)
	    break;
    } while(its < maxits);

    int retval = (its >= maxits);
    for (int i = 0; i <= im; i++)
	SUPERLU_FREE(vv[i]);
    SUPERLU_FREE(vv);
    for (int i = 0; i < im; i++)
    {
	SUPERLU_FREE(hh[i]);
	SUPERLU_FREE(z[i]);
    }
    SUPERLU_FREE(hh);
    SUPERLU_FREE(z);
    SUPERLU_FREE(c);
    SUPERLU_FREE(s);
    SUPERLU_FREE(rs);

    *itmax = its;

    return retval;
}